

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popBuffer(GLES2ResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> SVar2;
  
  lVar1 = CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)this,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)
             (*(long *)(lVar1 + 0x18) + (long)in_EDX * 0x10));
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
  ::erase((vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
           *)(lVar1 + 0x18),
          (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)
          ((long)in_EDX * 0x10 + *(long *)(lVar1 + 0x18)));
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (Buffer *)this;
  return SVar2;
}

Assistant:

SharedPtr<Buffer> GLES2ResourceManager::popBuffer (int index)
{
	SharedPtr<Buffer> buffer = m_buffers[index];

	m_buffers.erase(m_buffers.begin() + index);

	return buffer;
}